

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O3

void __thiscall Memory::PageHeapData::~PageHeapData(PageHeapData *this)

{
  StackBackTrace *pSVar1;
  
  pSVar1 = this->pageHeapAllocStack;
  if (pSVar1 != (StackBackTrace *)0x0) {
    if (pSVar1 != s_StackTraceAllocFailed) {
      DeleteObject<Memory::NoThrowHeapAllocator,(Memory::AllocatorDeleteFlags)0,StackBackTrace>
                ((AllocatorType *)&NoThrowHeapAllocator::Instance,pSVar1,
                 (ulong)pSVar1->requestedFramesToCapture << 3);
    }
    this->pageHeapAllocStack = (StackBackTrace *)0x0;
  }
  pSVar1 = this->pageHeapFreeStack;
  if (pSVar1 != (StackBackTrace *)0x0) {
    DeleteObject<Memory::NoThrowHeapAllocator,(Memory::AllocatorDeleteFlags)0,StackBackTrace>
              ((AllocatorType *)&NoThrowHeapAllocator::Instance,pSVar1,
               (ulong)pSVar1->requestedFramesToCapture << 3);
    this->pageHeapFreeStack = (StackBackTrace *)0x0;
  }
  return;
}

Assistant:

PageHeapData::~PageHeapData()
{
#ifdef STACK_BACK_TRACE
    if (this->pageHeapAllocStack != nullptr)
    {
        if (this->pageHeapAllocStack != PageHeapData::s_StackTraceAllocFailed)
        {
            this->pageHeapAllocStack->Delete(&NoThrowHeapAllocator::Instance);
        }
        this->pageHeapAllocStack = nullptr;
    }

    // REVIEW: This means that the old free stack is lost when we get free the heap block
    // Is this okay? Should we delay freeing heap blocks till process/thread shutdown time?
    if (this->pageHeapFreeStack != nullptr)
    {
        this->pageHeapFreeStack->Delete(&NoThrowHeapAllocator::Instance);
        this->pageHeapFreeStack = nullptr;
    }
#endif
}